

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall
TArray<level_info_t,_level_info_t>::Reserve(TArray<level_info_t,_level_info_t> *this,uint amount)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar2 = (ulong)uVar1;
  this->Count = amount + uVar1;
  if (uVar1 < amount + uVar1) {
    lVar3 = uVar2 * 0x1c8;
    do {
      level_info_t::level_info_t((level_info_t *)((long)&this->Array->levelnum + lVar3));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x1c8;
    } while (uVar2 < this->Count);
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}